

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SerializeWithCachedSizes
          (CodeGeneratorRequest *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar1;
  uint uVar2;
  char *data;
  string *psVar3;
  void *pvVar4;
  Type *pTVar5;
  Type *value;
  int iVar6;
  
  iVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar1) {
    this_00 = &this->file_to_generate_;
    iVar6 = 0;
    do {
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar6);
      data = (pTVar5->_M_dataplus)._M_p;
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar6);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar5->_M_string_length,SERIALIZE,
                 "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar6);
      internal::WireFormatLite::WriteString(1,pTVar5,output);
      iVar6 = iVar6 + 1;
    } while (iVar1 != iVar6);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    psVar3 = (this->parameter_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    internal::WireFormatLite::WriteStringMaybeAliased(2,(this->parameter_).ptr_,output);
  }
  if ((uVar2 & 2) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray
              (3,(MessageLite *)this->compiler_version_,output);
  }
  iVar1 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar6 = 0;
    do {
      value = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                        (&(this->proto_file_).super_RepeatedPtrFieldBase,iVar6);
      internal::WireFormatLite::WriteMessageMaybeToArray(0xf,(MessageLite *)value,output);
      iVar6 = iVar6 + 1;
    } while (iVar1 != iVar6);
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    return;
  }
  internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void CodeGeneratorRequest::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->file_to_generate_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->file_to_generate(i).data(), this->file_to_generate(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->file_to_generate(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->parameter(), output);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, *this->compiler_version_, output);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0, n = this->proto_file_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      15, this->proto_file(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.compiler.CodeGeneratorRequest)
}